

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall ParamNode::~ParamNode(ParamNode *this)

{
  ParamNode *this_local;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__ParamNode_00145bb8;
  std::__cxx11::string::~string((string *)&this->name);
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

ParamNode() : Node(NodeKind::ParamNode) { }